

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

ptr<async_result<bool>_> __thiscall
cornerstone::raft_server::append_entries
          (raft_server *this,
          vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
          *logs)

{
  log_val_type *plVar1;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  log_val_type *__args_2;
  shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>_> sVar3;
  ptr<async_result<bool>_> pVar4;
  ptr<req_msg> req;
  unsigned_long local_68;
  undefined1 local_60 [16];
  int local_50 [2];
  ptr<log_entry> log;
  
  if (in_RDX[1] == *in_RDX) {
    req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 0;
    sVar3 = std::make_shared<cornerstone::async_result<bool,std::shared_ptr<std::exception>>,bool&>
                      ((bool *)this);
    _Var2 = sVar3.
            super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  }
  else {
    log.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_50[1] = 5;
    local_50[0] = 0;
    local_60._12_4_ = 0;
    local_60._0_8_ = (_func_void_buffer_ptr *)0x0;
    local_68 = 0;
    std::
    make_shared<cornerstone::req_msg,unsigned_long,cornerstone::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
              ((unsigned_long *)&req,(msg_type *)&log,local_50 + 1,local_50,
               (unsigned_long *)(local_60 + 0xc),(unsigned_long *)local_60,&local_68);
    plVar1 = (log_val_type *)in_RDX[1];
    for (__args_2 = (log_val_type *)*in_RDX; __args_2 != plVar1; __args_2 = __args_2 + 4) {
      local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
      local_68 = CONCAT44(local_68._4_4_,1);
      std::
      make_shared<cornerstone::log_entry,int,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,cornerstone::log_val_type>
                ((int *)&log,
                 (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)local_60,
                 __args_2);
      std::
      vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
      ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   *)(CONCAT71(req.
                               super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._1_7_,
                               req.
                               super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._0_1_) + 0x38),&log);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&log.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    send_msg_to_leader(this,(ptr<req_msg> *)logs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    _Var2._M_pi = extraout_RDX;
  }
  pVar4.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  pVar4.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<async_result<bool>_>)
         pVar4.
         super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<async_result<bool>> raft_server::append_entries(std::vector<bufptr>& logs)
{
    if (logs.size() == 0)
    {
        bool result(false);
        return cs_new<async_result<bool>>(result);
    }

    ptr<req_msg> req(cs_new<req_msg>((ulong)0, msg_type::client_request, 0, 0, (ulong)0, (ulong)0, (ulong)0));
    for (auto& item : logs)
    {
        ptr<log_entry> log(cs_new<log_entry>(0, std::move(item), log_val_type::app_log));
        req->log_entries().push_back(log);
    }

    return send_msg_to_leader(req);
}